

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::impl::
     distribute_scatter<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,
               size_t total_size,comm *comm)

{
  comm *global_size;
  bool bVar1;
  uint uVar2;
  uint comm_rank;
  int iVar3;
  size_t sVar4;
  reference pvVar5;
  reference msgs;
  reference piVar6;
  pair<unsigned_long,_int> pVar7;
  size_t recv_size;
  int i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_sizes;
  undefined1 local_a8 [8];
  blk_dist part;
  int root;
  pair<unsigned_long,_int> max_pos;
  comm *local_38;
  size_t local_size;
  comm *comm_local;
  size_t total_size_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  local_size = (size_t)comm;
  comm_local = (comm *)total_size;
  total_size_local = (size_t)out._M_current;
  out_local._M_current = end._M_current;
  end_local = begin;
  local_38 = (comm *)std::
                     distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                               (begin,end);
  pVar7 = max_element<unsigned_long>((unsigned_long *)&local_38,(comm *)local_size);
  part.div1mod._4_4_ = pVar7.second;
  bVar1 = all_same<int>((int *)((long)&part.div1mod + 4),(comm *)local_size);
  if (!bVar1) {
    assert_fail("mxx::all_same(root, comm)",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                ,0x42,"distribute_scatter");
  }
  global_size = comm_local;
  uVar2 = mxx::comm::size((comm *)local_size);
  comm_rank = mxx::comm::rank((comm *)local_size);
  blk_dist_buf::blk_dist_buf((blk_dist_buf *)local_a8,(size_t)global_size,uVar2,comm_rank);
  iVar3 = mxx::comm::rank((comm *)local_size);
  if (iVar3 == part.div1mod._4_4_) {
    if (local_38 != comm_local) {
      assert_fail("local_size == total_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                  ,0x47,"distribute_scatter");
    }
    iVar3 = mxx::comm::size((comm *)local_size);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&recv_size + 7));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,(long)iVar3,
               (allocator<unsigned_long> *)((long)&recv_size + 7));
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&recv_size + 7));
    recv_size._0_4_ = 0;
    while( true ) {
      uVar2 = (uint)recv_size;
      iVar3 = mxx::comm::size((comm *)local_size);
      if (iVar3 <= (int)uVar2) break;
      sVar4 = blk_dist_buf::local_size((blk_dist_buf *)local_a8,(uint)recv_size);
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,
                          (long)(int)(uint)recv_size);
      *pvVar5 = sVar4;
      recv_size._0_4_ = (uint)recv_size + 1;
    }
    msgs = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
           operator*(&end_local);
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &total_size_local);
    sVar4 = blk_dist_buf::local_size((blk_dist_buf *)local_a8);
    scatterv<int>(msgs,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i,piVar6,sVar4,
                  part.div1mod._4_4_,(comm *)local_size);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&i);
  }
  else {
    sVar4 = blk_dist_buf::local_size((blk_dist_buf *)local_a8);
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &total_size_local);
    scatterv_recv<int>(piVar6,sVar4,part.div1mod._4_4_,(comm *)local_size);
  }
  blk_dist_buf::~blk_dist_buf((blk_dist_buf *)local_a8);
  return;
}

Assistant:

void distribute_scatter(_InIterator begin, _InIterator end, _OutIterator out, size_t total_size, const mxx::comm& comm) {
        size_t local_size = std::distance(begin, end);
        // get root
        std::pair<size_t, int> max_pos = mxx::max_element(local_size, comm);
        int root = max_pos.second;
        MXX_ASSERT(mxx::all_same(root, comm));
        blk_dist part(total_size, comm.size(), comm.rank());


        if (comm.rank() == root) {
            MXX_ASSERT(local_size == total_size);
            // use scatterv to send
            std::vector<size_t> send_sizes(comm.size());
            for (int i = 0; i < comm.size(); ++i) {
                send_sizes[i] = part.local_size(i);
            }
            // TODO: scatterv with iterators rather than pointers
            mxx::scatterv(&(*begin), send_sizes, &(*out), part.local_size(), root, comm);
        } else {
            // use scatterv to receive
            size_t recv_size = part.local_size();
            mxx::scatterv_recv(&(*out), recv_size, root, comm);
        }
    }